

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O2

Vector3d *
Object::getIntersection
          (Vector3d *__return_storage_ptr__,Vector2d *vec,Vector3d *_p1,Vector3d *_p2,Vector2d *obs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  PointerType ptr;
  Vector2d pt;
  PlainObjectBase<Eigen::Matrix<double,2,2,0,2,2>> *local_98;
  double *local_90;
  long local_88;
  long local_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  PlainObjectBase<Eigen::Matrix<double,2,2,0,2,2>> local_48 [16];
  double local_38;
  double local_30;
  
  dVar2 = (_p1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [0];
  dVar3 = (_p1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [1];
  local_78 = (_p2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[0] - dVar2;
  dStack_70 = (_p2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[1] - dVar3;
  local_90 = (double *)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,2,2,0,2,2>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,2,0,2,2>>>
            (local_48,(DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                       *)&local_98);
  local_38 = (vec->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
             array[0];
  dVar1 = -(vec->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
           array[1];
  local_48._8_4_ = SUB84(dStack_70,0);
  local_48._0_8_ = dVar1;
  local_48._12_4_ = (int)((ulong)-dStack_70 >> 0x20);
  local_30 = local_78;
  local_68 = local_38 *
             (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
             array[1] +
             dVar1 * (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                     m_data.array[0];
  dStack_60 = local_78 * dVar3 + -dStack_70 * dVar2;
  if (1e-05 <= ABS(dVar1 * local_78 + dStack_70 * local_38)) {
    local_90 = &local_68;
    local_98 = local_48;
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    _set_noalias<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,2,2,0,2,2>>,Eigen::Matrix<double,2,1,0,2,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&local_58,
               (DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>_>
                *)&local_98);
    dVar1 = atan2(dStack_50 -
                  (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[1],
                  local_58 -
                  (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[0]);
    Eigen::CommaInitializer<Eigen::Matrix<double,3,1,0,3,1>>::
    CommaInitializer<Eigen::Matrix<double,2,1,0,2,1>>
              ((CommaInitializer<Eigen::Matrix<double,3,1,0,3,1>> *)&local_98,__return_storage_ptr__
               ,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_58);
    lVar4 = 0;
    if (local_88 != 1) {
      lVar4 = local_88 * 0x18;
      local_80 = 0;
    }
    *(double *)(local_98 + local_80 * 8 + (long)local_90 * 8 + lVar4) = dVar1;
  }
  else {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[2] =
         (_p1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [2];
    dVar1 = (_p1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[1];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[0] =
         (_p1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [0];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[1] = dVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d Object::getIntersection(
    const Eigen::Vector2d& vec,
    const Eigen::Vector3d& _p1,
    const Eigen::Vector3d& _p2, 
    const Eigen::Vector2d& obs
) {
    const Eigen::Vector2d p1 = _p1.block<2, 1>(0, 0), p2 = _p2.block<2, 1>(0, 0);
    const Eigen::Vector2d vec_line = p2 - p1;
    Eigen::Matrix2d A = Eigen::Matrix2d::Zero();
    A << -vec(1), vec(0), -vec_line(1), vec_line(0);
    double b1 = Eigen::RowVector2d(-vec(1), vec(0)) * obs;
    double b2 = Eigen::RowVector2d(-vec_line(1), vec_line(0)) * p1;
    const Eigen::Vector2d b(b1, b2);
    double det = A(0, 0) * A(1, 1) - A(0, 1) * A(1, 0);
    if (std::abs(det) < 1e-5)
        return _p1;
    const Eigen::Vector2d pt = A.inverse() * b, new_vec = pt - obs;
    double angle = atan2(new_vec(1), new_vec(0));
    Eigen::Vector3d result;
    result << pt, angle;
    return result;                   // 解交点
}